

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execCmpa<(moira::Instr)38,(moira::Mode)5,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  i32 iVar2;
  ushort in_SI;
  u32 *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  int src;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  i32 iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = readOp<(moira::Mode)5,(moira::Size)4,128ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),in_stack_ffffffffffffffe4,in_RDI,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    iVar2 = SEXT<(moira::Size)4>((ulong)in_stack_ffffffffffffffe4);
    iVar3 = iVar2;
    readA<(moira::Size)4>
              ((Moira *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    cmp<(moira::Size)4>((Moira *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                        (u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    prefetch<4ul>((Moira *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,2);
  }
  return;
}

Assistant:

void
Moira::execCmpa(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    data = SEXT<S>(data);
    cmp<Long>(data, readA(dst));
    prefetch<POLLIPL>();

    sync(2);
}